

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_NotNull_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_NotNull_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  AssertionHelper local_7c8;
  Fixed local_798;
  undefined1 local_610 [8];
  AssertionResult iutest_ar_3;
  void *p_3;
  Fixed local_5b0;
  undefined1 local_428 [8];
  AssertionResult iutest_ar_2;
  void *p_2;
  Fixed local_3c8;
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  void *p_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  void *p;
  iu_GTestSyntaxTest_x_iutest_x_NotNull_Test *this_local;
  
  iutest_ar._32_8_ = this;
  if (this != (iu_GTestSyntaxTest_x_iutest_x_NotNull_Test *)0x0) {
    iutest::detail::AlwaysZero();
    iutest::internal::NullHelper<false>::CompareNe<void>
              ((AssertionResult *)local_40,"(p)",(void *)iutest_ar._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
    if (!bVar1) {
      memset(&local_1d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1d8,(void *)iutest_ar._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_40);
      iutest::AssertionHelper::AssertionHelper
                (&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x149,pcVar3,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_208,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_208);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
    if (!bVar1) {
      return;
    }
  }
  iutest_ar_1._32_8_ = this;
  if (this != (iu_GTestSyntaxTest_x_iutest_x_NotNull_Test *)0x0) {
    iutest::detail::AlwaysZero();
    iutest::internal::NullHelper<false>::CompareNe<void>
              ((AssertionResult *)local_240,"(p)",(void *)iutest_ar_1._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3c8,(void *)iutest_ar_1._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&p_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x14b,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&p_2,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&p_2);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  }
  iutest_ar_2._32_8_ = this;
  if (this != (iu_GTestSyntaxTest_x_iutest_x_NotNull_Test *)0x0) {
    iutest::detail::AlwaysZero();
    iutest::internal::NullHelper<false>::CompareNe<void>
              ((AssertionResult *)local_428,"(p)",(void *)iutest_ar_2._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar1) {
      memset(&local_5b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5b0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5b0,(void *)iutest_ar_2._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_428);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&p_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x14d,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&p_3,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&p_3);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5b0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  }
  if (this != (iu_GTestSyntaxTest_x_iutest_x_NotNull_Test *)0x0) {
    iutest_ar_3._32_8_ = this;
    iutest::detail::AlwaysZero();
    iutest::internal::NullHelper<false>::CompareNe<void>
              ((AssertionResult *)local_610,"(p)",(void *)iutest_ar_3._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
    if (!bVar1) {
      memset(&local_798,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_798);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_798,(void *)iutest_ar_3._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_610);
      iutest::AssertionHelper::AssertionHelper
                (&local_7c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x14f,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7c8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7c8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_798);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  }
  return;
}

Assistant:

TEST(GTestSyntaxTest, NotNull)
{
    if( void* p = this )
        ASSERT_NOTNULL(p) << p;
    if( void* p = this )
        EXPECT_NOTNULL(p) << p;
    if( void* p = this )
        INFORM_NOTNULL(p) << p;
    if( void* p = this )
        ASSUME_NOTNULL(p) << p;
}